

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O3

bool deqp::egl::anon_unknown_3::checkVersionString
               (TestLog *log,Functions *gl,bool desktop,int major,int minor)

{
  ostringstream *this;
  byte bVar1;
  bool bVar2;
  GLenum GVar3;
  GLubyte *pGVar4;
  byte *pbVar5;
  int iVar6;
  long lVar7;
  GLubyte GVar8;
  int iVar9;
  undefined7 in_register_00000011;
  char *pcVar10;
  deInt32 profile;
  GLint local_1b4;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  pGVar4 = (*gl->getString)(0x1f02);
  local_1b0._0_8_ = log;
  if ((int)CONCAT71(in_register_00000011,desktop) == 0) {
    pcVar10 = "OpenGL ES ";
    if (major == 1) {
      pcVar10 = "OpenGL ES-CM ";
    }
    GVar8 = *pcVar10;
    if (GVar8 != '\0') {
      lVar7 = 0;
      do {
        if (GVar8 != pGVar4[lVar7]) {
          this = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,"Invalid version string prefix. Expected \'",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,pcVar10,(ulong)(major == 1) * 3 + 10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\'.",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_002007f7;
        }
        GVar8 = ((GLubyte *)pcVar10)[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (GVar8 != '\0');
      pGVar4 = pGVar4 + lVar7;
    }
  }
  iVar6 = 0;
  for (pbVar5 = pGVar4 + 2; bVar1 = pbVar5[-2], bVar1 != 0; pbVar5 = pbVar5 + 1) {
    if (bVar1 == 0x2e) {
      iVar9 = 0;
      goto LAB_0020042e;
    }
    if ((byte)(bVar1 - 0x3a) < 0xf6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Failed to parse major version number. Not a number.",
                 0x33);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_002007f7;
    }
    if (iVar6 == 0 && (char)bVar1 + -0x30 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "Failed to parse major version number. Begins with zero.",0x37);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_002007f7;
    }
    iVar6 = (char)bVar1 + -0x30 + iVar6 * 10;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 8),
             "Failed to parse version. Expected \'.\' after major version number.",0x41);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_002007f7:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  return false;
LAB_0020042e:
  bVar1 = pbVar5[-1];
  if (((ulong)bVar1 < 0x2f) && ((0x400100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
    if (!desktop) {
      if (iVar6 < major) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),"Major version is less than required.",0x24);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        if (iVar6 != major) {
          return true;
        }
        if (minor <= iVar9) {
          return true;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),"Minor version is less than required.",0x24);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      goto LAB_002007f7;
    }
    if (iVar6 < major) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Major version is less than required.",0x24);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_002007f7;
    }
    if ((iVar6 == major) && (iVar9 < minor)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Minor version is less than required.",0x24);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_002007f7;
    }
    bVar2 = true;
    if ((iVar6 == major) && (iVar9 == minor)) {
      return true;
    }
    if ((major < 3) || ((major ^ 3U) == 0 && minor == 0)) {
      if ((iVar6 == 3) && (iVar9 == 1)) {
        local_1b0._0_8_ = (TestLog *)(local_1b0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"GL_ARB_compatibility","");
        bVar2 = glu::hasExtension(gl,(ApiType)0x113,(string *)local_1b0);
        if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
        }
        if (bVar2) {
          return true;
        }
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),
                   "Required OpenGL 3.0 or earlier. Got OpenGL 3.1 without GL_ARB_compatibility.",
                   0x4c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_002007f7;
      }
      if ((iVar6 < 4) && (iVar6 != 3 || iVar9 < minor)) {
        return false;
      }
      local_1b4 = 0;
      (*gl->getIntegerv)(0x9126,&local_1b4);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glGetIntegerv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                      ,0x23a);
      bVar2 = local_1b4 == 2;
      if (bVar2) {
        return bVar2;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "Required OpenGL 3.0 or earlier. Got later version without compatibility profile.",
                 0x50);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else if ((major ^ 3U) == 0 && minor == 1) {
      if (iVar6 < 4) {
        if (iVar6 != 3) {
          return false;
        }
        if (iVar9 < 1) {
          return false;
        }
      }
      local_1b4 = 0;
      (*gl->getIntegerv)(0x9126,&local_1b4);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glGetIntegerv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                      ,0x250);
      bVar2 = local_1b4 == 1;
      if (bVar2) {
        return bVar2;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "Required OpenGL 3.1. Got later version without core profile.",0x3c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Couldn\'t do any further compatibilyt checks.",0x2c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
    return bVar2;
  }
  if ((byte)(bVar1 - 0x3a) < 0xf6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Failed to parse minor version number. Not a number.",0x33
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_002007f7;
  }
  if ((iVar9 == 0 && (char)bVar1 + -0x30 == 0) &&
     ((0x2e < (ulong)*pbVar5 || ((0x400100000001U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))))
  goto LAB_002007c1;
  iVar9 = (char)bVar1 + -0x30 + iVar9 * 10;
  pbVar5 = pbVar5 + 1;
  goto LAB_0020042e;
LAB_002007c1:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 8),"Failed to parse minor version number. Leading zeros.",0x34)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  goto LAB_002007f7;
}

Assistant:

bool checkVersionString (TestLog& log, const glw::Functions& gl, bool desktop, int major, int minor)
{
	const char* const	versionStr	= (const char*)gl.getString(GL_VERSION);
	const char*			iter		= versionStr;

	int majorVersion = 0;
	int minorVersion = 0;

	// Check embedded version prefixes
	if (!desktop)
	{
		const char* prefix		= NULL;
		const char* prefixIter	= NULL;

		if (major == 1)
			prefix = "OpenGL ES-CM ";
		else
			prefix = "OpenGL ES ";

		prefixIter = prefix;

		while (*prefixIter)
		{
			if ((*prefixIter) != (*iter))
			{
				log << TestLog::Message << "Invalid version string prefix. Expected '" << prefix << "'." << TestLog::EndMessage;
				return false;
			}

			prefixIter++;
			iter++;
		}
	}

	while ((*iter) && (*iter) != '.')
	{
		const int val = (*iter) - '0';

		// Not a number
		if (val < 0 || val > 9)
		{
			log << TestLog::Message << "Failed to parse major version number. Not a number." << TestLog::EndMessage;
			return false;
		}

		// Leading zero
		if (majorVersion == 0 && val == 0)
		{
			log << TestLog::Message << "Failed to parse major version number. Begins with zero." << TestLog::EndMessage;
			return false;
		}

		majorVersion = majorVersion * 10 + val;

		iter++;
	}

	// Invalid format
	if ((*iter) != '.')
	{
		log << TestLog::Message << "Failed to parse version. Expected '.' after major version number." << TestLog::EndMessage;
		return false;
	}

	iter++;

	while ((*iter) && (*iter) != ' ' && (*iter) != '.')
	{
		const int val = (*iter) - '0';

		// Not a number
		if (val < 0 || val > 9)
		{
			log << TestLog::Message << "Failed to parse minor version number. Not a number." << TestLog::EndMessage;
			return false;
		}

		// Leading zero
		if (minorVersion == 0 && val == 0)
		{
			// Leading zeros in minor version
			if ((*(iter + 1)) != ' ' && (*(iter + 1)) != '.' && (*(iter + 1)) != '\0')
			{
				log << TestLog::Message << "Failed to parse minor version number. Leading zeros." << TestLog::EndMessage;
				return false;
			}
		}

		minorVersion = minorVersion * 10 + val;

		iter++;
	}

	// Invalid format
	if ((*iter) != ' ' && (*iter) != '.' && (*iter) != '\0')
		return false;

	if (desktop)
	{
		if (majorVersion < major)
		{
			log << TestLog::Message << "Major version is less than required." << TestLog::EndMessage;
			return false;
		}
		else if (majorVersion == major && minorVersion < minor)
		{
			log << TestLog::Message << "Minor version is less than required." << TestLog::EndMessage;
			return false;
		}
		else if (majorVersion == major && minorVersion == minor)
			return true;

		if (major < 3 || (major == 3 && minor == 0))
		{
			if (majorVersion == 3 && minorVersion == 1)
			{
				if (glu::hasExtension(gl, glu::ApiType::core(3, 1), "GL_ARB_compatibility"))
					return true;
				else
				{
					log << TestLog::Message << "Required OpenGL 3.0 or earlier. Got OpenGL 3.1 without GL_ARB_compatibility." << TestLog::EndMessage;
					return false;
				}
			}
			else if (majorVersion > 3 || (majorVersion == 3 && minorVersion >= minor))
			{
				deInt32 profile = 0;

				gl.getIntegerv(GL_CONTEXT_PROFILE_MASK, &profile);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

				if (profile == GL_CONTEXT_COMPATIBILITY_PROFILE_BIT)
					return true;
				else
				{
					log << TestLog::Message << "Required OpenGL 3.0 or earlier. Got later version without compatibility profile." << TestLog::EndMessage;
					return false;
				}
			}
			else
				DE_ASSERT(false);

			return false;
		}
		else if (major == 3 && minor == 1)
		{
			if (majorVersion > 3 || (majorVersion == 3 && minorVersion >= minor))
			{
				deInt32 profile = 0;

				gl.getIntegerv(GL_CONTEXT_PROFILE_MASK, &profile);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

				if (profile == GL_CONTEXT_CORE_PROFILE_BIT)
					return true;
				else
				{
					log << TestLog::Message << "Required OpenGL 3.1. Got later version without core profile." << TestLog::EndMessage;
					return false;
				}
			}
			else
				DE_ASSERT(false);

			return false;
		}
		else
		{
			log << TestLog::Message << "Couldn't do any further compatibilyt checks." << TestLog::EndMessage;
			return true;
		}
	}
	else
	{
		if (majorVersion < major)
		{
			log << TestLog::Message << "Major version is less than required." << TestLog::EndMessage;
			return false;
		}
		else if (majorVersion == major && minorVersion < minor)
		{
			log << TestLog::Message << "Minor version is less than required." << TestLog::EndMessage;
			return false;
		}
		else
			return true;
	}
}